

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *
soul::AST::CommaSeparatedList::getAsExpressionList
          (ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>
           *__return_storage_ptr__,pool_ptr<soul::AST::Expression> *expressionOrList)

{
  bool bVar1;
  CommaSeparatedList *pCVar2;
  Expression *o;
  pool_ref<soul::AST::Expression> local_48;
  undefined1 local_39;
  uint local_38;
  pool_ptr<soul::AST::Expression> local_28;
  pool_ptr<soul::AST::CommaSeparatedList> local_20;
  pool_ptr<soul::AST::CommaSeparatedList> csl;
  pool_ptr<soul::AST::Expression> *expressionOrList_local;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *list;
  
  local_28 = (pool_ptr<soul::AST::Expression>)expressionOrList->object;
  csl.object = (CommaSeparatedList *)expressionOrList;
  cast<soul::AST::CommaSeparatedList,soul::AST::Expression>((soul *)&local_20,&local_28);
  pool_ptr<soul::AST::Expression>::~pool_ptr(&local_28);
  bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_20);
  if (bVar1) {
    pCVar2 = pool_ptr<soul::AST::CommaSeparatedList>::operator->(&local_20);
    ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::ArrayWithPreallocation
              (__return_storage_ptr__,&pCVar2->items);
  }
  local_38 = (uint)bVar1;
  pool_ptr<soul::AST::CommaSeparatedList>::~pool_ptr(&local_20);
  if (local_38 == 0) {
    local_39 = 0;
    ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::ArrayWithPreallocation
              (__return_storage_ptr__);
    bVar1 = pool_ptr<soul::AST::Expression>::operator!=(expressionOrList,(void *)0x0);
    if (bVar1) {
      o = pool_ptr<soul::AST::Expression>::operator*(expressionOrList);
      pool_ref<soul::AST::Expression>::pool_ref<soul::AST::Expression,void>(&local_48,o);
      ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::push_back
                (__return_storage_ptr__,&local_48);
      pool_ref<soul::AST::Expression>::~pool_ref(&local_48);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static auto getAsExpressionList (pool_ptr<Expression> expressionOrList)
        {
            if (auto csl = cast<CommaSeparatedList> (expressionOrList))
                return csl->items;

            decltype(CommaSeparatedList::items) list;

            if (expressionOrList != nullptr)
                list.push_back (*expressionOrList);

            return list;
        }